

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O2

void __thiscall cp::CoMTrack::calcCoMTrack(CoMTrack *this,Vector2 *ref_cp)

{
  undefined1 local_b0 [8];
  LhsNested local_a8;
  scalar_constant_op<double> local_a0;
  scalar_constant_op<double> local_98;
  Vector2 com_pos;
  Vector2 com_vel;
  Vector2 now_com_pos;
  undefined1 local_48 [16];
  scalar_constant_op<double> local_38;
  
  local_a8 = (LhsNested)0x0;
  local_a0.m_other = 4.94065645841247e-324;
  local_98.m_other = 4.94065645841247e-324;
  now_com_pos.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = *(double *)(this + 0x48);
  local_b0 = (undefined1  [8])&now_com_pos;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b0,
             (Scalar *)(this + 0x50));
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b0);
  local_48._0_8_ = ref_cp;
  local_48._8_8_ = &now_com_pos;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)local_b0,(double *)(this + 0x40),(StorageBaseType *)local_48);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)&com_vel,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)local_b0);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)local_48,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)&com_vel,
             (double *)(this + 0x38));
  local_a8 = (LhsNested)local_48._0_8_;
  local_98.m_other = local_38.m_other;
  local_b0 = (undefined1  [8])&now_com_pos;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,2,1,0,2,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
            (&com_pos,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                       *)local_b0);
  *(double *)(this + 0x48) =
       com_pos.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
       [0];
  *(double *)(this + 0x50) =
       com_pos.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
       [1];
  return;
}

Assistant:

void CoMTrack::calcCoMTrack(const Vector2& ref_cp) {
  Vector2 now_com_pos, com_vel, com_pos;
  now_com_pos << ref_com[0], ref_com[1];
  com_vel = w_s * (ref_cp - now_com_pos);
  com_pos = now_com_pos + com_vel * dt_s;
  ref_com[0] = com_pos[0];
  ref_com[1] = com_pos[1];
}